

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

SUNErrCode SUNMatScaleAdd_Dense(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  plVar1 = (long *)A->content;
  lVar2 = plVar1[1];
  if (0 < lVar2) {
    lVar3 = *plVar1;
    lVar6 = 0;
    do {
      if (0 < lVar3) {
        lVar4 = *(long *)(plVar1[4] + lVar6 * 8);
        lVar5 = *(long *)(*(long *)((long)B->content + 0x20) + lVar6 * 8);
        lVar7 = 0;
        do {
          *(double *)(lVar4 + lVar7 * 8) =
               *(double *)(lVar4 + lVar7 * 8) * c + *(double *)(lVar5 + lVar7 * 8);
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Dense(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation A = c*A + B */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(A, i, j) = c * SM_ELEMENT_D(A, i, j) + SM_ELEMENT_D(B, i, j);
    }
  }

  return SUN_SUCCESS;
}